

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

TypedDeleter<LLVMBC::MDNode> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::MDNode>,LLVMBC::MDNode*&>
          (LLVMContext *this,MDNode **u)

{
  TypedDeleter<LLVMBC::MDNode> *this_00;
  TypedDeleter<LLVMBC::MDNode> *t;
  TypedDeleter<LLVMBC::MDNode> *mem;
  MDNode **u_local;
  LLVMContext *this_local;
  
  this_00 = (TypedDeleter<LLVMBC::MDNode> *)allocate(this,0x10,8);
  if (this_00 == (TypedDeleter<LLVMBC::MDNode> *)0x0) {
    std::terminate();
  }
  TypedDeleter<LLVMBC::MDNode>::TypedDeleter(this_00,*u);
  return this_00;
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}